

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::MultiUPCEANReader::decodePattern
          (Barcode *__return_storage_ptr__,MultiUPCEANReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  double dVar4;
  PatternView begin;
  PatternView begin_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined2 uVar9;
  undefined1 uVar10;
  Iterator puVar11;
  Iterator puVar12;
  BarcodeFormat format;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  bool bVar21;
  char cVar22;
  char cVar23;
  ushort uVar24;
  uint uVar25;
  int *piVar26;
  ulong uVar27;
  Iterator puVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *upce;
  uint uVar32;
  int iVar33;
  Iterator *ppuVar34;
  ushort *puVar35;
  ushort uVar36;
  ulong uVar37;
  Iterator puVar38;
  anon_class_16_2_7a905435 isGuard;
  Error error;
  PartialResult addOnRes;
  uint local_1e0;
  Iterator *local_1d8;
  uint local_1cc;
  PatternView local_1b8;
  undefined8 local_198;
  undefined2 uStack_190;
  undefined1 uStack_18e;
  PartialResult local_188;
  PartialResult local_140;
  long local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  int local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ushort *local_c0;
  int iStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ushort *puStack_a8;
  ushort *local_a0;
  int iStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ushort *puStack_88;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  isGuard.minQuietZone = 6.0;
  isGuard.pattern = (FixedPattern<3,_3,_false> *)param_3;
  FindLeftGuard<3,ZXing::FindLeftGuard<3,3,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<3,3,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&local_140,(ZXing *)next,(PatternView *)0x21,0x1972d0,isGuard);
  uVar13 = local_198;
  next->_base = (Iterator)local_140.txt.field_2._M_allocated_capacity;
  next->_end = (Iterator)local_140.txt.field_2._8_8_;
  next->_data = (Iterator)local_140.txt._M_dataplus._M_p;
  *(size_type *)&next->_size = local_140.txt._M_string_length;
  puVar28 = next->_data;
  if (((puVar28 == (Iterator)0x0) || (puVar28 < next->_base)) ||
     (next->_end < puVar28 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_e4 = rowNumber;
  PartialResult::PartialResult(&local_140);
  local_198 = uVar13;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar16 = local_188.txt.field_2._8_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar13 = local_198;
  puVar28 = next->_data;
  puVar38 = next->_base;
  local_f8 = (long)next->_size;
  puVar35 = next->_end;
  uVar32 = (((this->super_RowReader)._opts)->_formats).i;
  local_188.txt.field_2._M_local_buf[0xc] = (char)((ulong)puVar35 >> 0x20);
  uVar8 = local_188.txt.field_2._M_local_buf[0xc];
  local_188.txt.field_2._M_local_buf[0xf] = (char)((ulong)puVar35 >> 0x38);
  uVar10 = local_188.txt.field_2._M_local_buf[0xf];
  local_188.txt.field_2._13_2_ = (undefined2)((ulong)puVar35 >> 0x28);
  uVar9 = local_188.txt.field_2._13_2_;
  local_188.txt.field_2._8_4_ = SUB84(puVar35,0);
  uVar7 = local_188.txt.field_2._8_4_;
  local_188.txt.field_2._M_allocated_capacity._0_4_ = SUB84(puVar38,0);
  uVar5 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  local_188.txt.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)puVar38 >> 0x20);
  uVar6 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  if (uVar32 != 0 && (uVar32 & 0x4200) == 0) {
LAB_00163f46:
    local_188.txt.field_2._M_local_buf[0xf] = uVar19;
    local_188.txt.field_2._13_2_ = uVar18;
    local_188.txt.field_2._M_local_buf[0xc] = uVar17;
    local_188.txt.field_2._8_4_ = uVar16;
    local_188.txt.field_2._M_allocated_capacity._4_4_ = uVar15;
    local_188.txt.field_2._M_allocated_capacity._0_4_ = uVar14;
    local_198 = uVar13;
    uVar17 = local_198._7_1_;
    uVar32 = (((this->super_RowReader)._opts)->_formats).i;
    uVar13 = local_198;
    if (uVar32 == 0 || (uVar32 >> 8 & 1) != 0) {
      local_188.txt._M_dataplus._M_p = (pointer)(puVar28 + 0x28);
      local_188.txt._M_string_length = CONCAT44(local_188.txt._M_string_length._4_4_,3);
      puVar1 = puVar28 + 0x2b;
      local_188.txt.field_2._M_allocated_capacity._0_4_ = uVar5;
      local_188.txt.field_2._M_allocated_capacity._4_4_ = uVar6;
      local_188.txt.field_2._8_4_ = uVar7;
      local_188.txt.field_2._M_local_buf[0xc] = uVar8;
      local_188.txt.field_2._13_2_ = uVar9;
      local_188.txt.field_2._M_local_buf[0xf] = uVar10;
      if (puVar1 <= puVar35 && puVar38 <= local_188.txt._M_dataplus._M_p) {
        if (puVar1 == puVar35 + -1) {
          uVar32 = 0x7fffffff;
        }
        else {
          uVar32 = (uint)*puVar1;
        }
        local_198._7_1_ = uVar17;
        dVar4 = IsPattern<false,3,3>
                          ((PatternView *)&local_188,(FixedPattern<3,_3,_false> *)&END_PATTERN,
                           uVar32,3.0,0.0);
        uVar13 = local_198;
        uVar17 = local_198._7_1_;
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          lVar30 = -10;
          uVar24 = 0;
          do {
            uVar24 = uVar24 + *(short *)((long)puVar28 + lVar30 + 0x30);
            lVar30 = lVar30 + 2;
          } while (lVar30 != 0);
          dVar4 = (double)uVar24 / 5.0;
          lVar30 = 0;
          do {
            if (dVar4 * 0.5 + 0.5 < ABS((double)puVar28[lVar30 + 0x13] - dVar4)) goto LAB_001642c2;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 5);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            if ((int)local_f8 == 0) {
              uVar32 = 0;
            }
            else {
              lVar30 = 0;
              uVar24 = 0;
              do {
                uVar24 = uVar24 + *(short *)((long)puVar28 + lVar30);
                lVar30 = lVar30 + 2;
              } while (local_f8 * 2 != lVar30);
              uVar32 = (uint)uVar24;
            }
            lVar30 = -10;
            uVar24 = 0;
            do {
              uVar24 = uVar24 + *(short *)((long)puVar28 + lVar30 + 0x30);
              lVar30 = lVar30 + 2;
            } while (lVar30 != 0);
            if ((long)(int)local_188.txt._M_string_length == 0) {
              uVar25 = 0;
            }
            else {
              lVar30 = 0;
              uVar36 = 0;
              do {
                uVar36 = uVar36 + *(short *)(local_188.txt._M_dataplus._M_p + lVar30);
                lVar30 = lVar30 + 2;
              } while ((long)(int)local_188.txt._M_string_length * 2 != lVar30);
              uVar25 = (uint)uVar36;
            }
            local_1b8._data = (Iterator)0x1800000003;
            lVar30 = 0;
            do {
              lVar31 = 0;
              do {
                uVar3 = *(undefined8 *)
                         (puVar28 + (long)*(int *)((long)&local_1b8._data + lVar30) + lVar31 * 4);
                if (0.2 <= ABS(((float)(ushort)((short)((ulong)uVar3 >> 0x30) +
                                                (short)((ulong)uVar3 >> 0x10) +
                                               (short)((ulong)uVar3 >> 0x20) + (short)uVar3) / 7.0)
                               / ((float)(uVar32 + uVar24 + uVar25) / 11.0) + -1.0))
                goto LAB_001642c2;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 4);
              lVar30 = lVar30 + 4;
            } while (lVar30 != 8);
            ppuVar34 = (Iterator *)(puVar28 + 3);
            local_1b8._size = 4;
            local_140.txt._M_string_length = 0;
            *local_140.txt._M_dataplus._M_p = '\0';
            local_1b8._data = (Iterator)ppuVar34;
            local_1b8._base = puVar38;
            local_1b8._end = puVar35;
            bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
            local_198 = uVar13;
            uVar13 = local_198;
            uVar17 = local_198._7_1_;
            if (bVar21) {
              uVar32 = 0xffffffff;
              local_1d8 = ppuVar34;
              do {
                local_198 = uVar13;
                uVar17 = local_198._7_1_;
                if (ppuVar34 == (Iterator *)0x0) {
                  ppuVar34 = (Iterator *)0x0;
                }
                else {
                  ppuVar34 = ppuVar34 + 1;
                  local_1d8 = ppuVar34;
                  local_1b8._data = (Iterator)ppuVar34;
                }
                uVar13 = local_198;
                if (uVar32 == 2) goto LAB_00164210;
                local_198._7_1_ = uVar17;
                bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
                uVar13 = local_198;
                uVar32 = uVar32 + 1;
              } while (bVar21);
              uVar17 = local_198._7_1_;
              if (2 < uVar32) {
LAB_00164210:
                local_198._7_1_ = uVar17;
                local_198 = uVar13;
                uVar17 = local_198._7_1_;
                local_1d8 = (Iterator *)((long)local_1d8 + 10);
                local_1b8._size = 4;
                local_1b8._data = (Iterator)local_1d8;
                local_1b8._base = puVar38;
                local_1b8._end = puVar35;
                uVar13 = local_198;
                local_198._7_1_ = uVar17;
                bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
                uVar13 = local_198;
                uVar17 = local_198._7_1_;
                if (bVar21) {
                  uVar32 = 0xffffffff;
                  do {
                    local_198 = uVar13;
                    uVar17 = local_198._7_1_;
                    if (local_1d8 == (Iterator *)0x0) {
                      local_1d8 = (Iterator *)0x0;
                    }
                    else {
                      local_1d8 = local_1d8 + 1;
                      local_1b8._data = (Iterator)local_1d8;
                    }
                    if (uVar32 == 2) goto LAB_00164290;
                    uVar13 = local_198;
                    local_198._7_1_ = uVar17;
                    bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
                    uVar13 = local_198;
                    uVar32 = uVar32 + 1;
                  } while (bVar21);
                  uVar17 = local_198._7_1_;
                  if (2 < uVar32) {
LAB_00164290:
                    local_140.end._end =
                         (Iterator)
                         CONCAT44(CONCAT13(local_188.txt.field_2._M_local_buf[0xf],
                                           CONCAT21(local_188.txt.field_2._13_2_,
                                                    local_188.txt.field_2._M_local_buf[0xc])),
                                  local_188.txt.field_2._8_4_);
                    local_140.end._size = (int)local_188.txt._M_string_length;
                    local_140.end._12_4_ = local_188.txt._M_string_length._4_4_;
                    local_140.format = EAN8;
                    goto LAB_00164684;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_001642c2:
    local_198._7_1_ = uVar17;
    local_198 = uVar13;
    uVar17 = local_198._7_1_;
    iVar33 = (((this->super_RowReader)._opts)->_formats).i;
    uVar13 = local_198;
    if (iVar33 == 0 || (short)iVar33 < 0) {
      local_188.txt._M_dataplus._M_p = (pointer)(puVar28 + 0x1b);
      local_188.txt._M_string_length = CONCAT44(local_188.txt._M_string_length._4_4_,6);
      puVar1 = puVar28 + 0x21;
      local_188.txt.field_2._M_allocated_capacity._0_4_ = uVar5;
      local_188.txt.field_2._M_allocated_capacity._4_4_ = uVar6;
      local_188.txt.field_2._8_4_ = uVar7;
      local_188.txt.field_2._M_local_buf[0xc] = uVar8;
      local_188.txt.field_2._13_2_ = uVar9;
      local_188.txt.field_2._M_local_buf[0xf] = uVar10;
      if (puVar1 <= puVar35 && puVar38 <= local_188.txt._M_dataplus._M_p) {
        if (puVar1 == puVar35 + -1) {
          uVar32 = 0x7fffffff;
        }
        else {
          uVar32 = (uint)*puVar1;
        }
        local_198._7_1_ = uVar17;
        dVar4 = IsPattern<false,6,6>
                          ((PatternView *)&local_188,(FixedPattern<6,_6,_false> *)UPCE_END_PATTERN,
                           uVar32,6.0,0.0);
        uVar13 = local_198;
        uVar17 = local_198._7_1_;
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          uVar25 = 0;
          uVar32 = 0;
          if ((int)local_f8 != 0) {
            lVar30 = 0;
            uVar24 = 0;
            do {
              uVar24 = uVar24 + *(short *)((long)puVar28 + lVar30);
              lVar30 = lVar30 + 2;
            } while (local_f8 * 2 != lVar30);
            uVar32 = (uint)uVar24;
          }
          if ((long)(int)local_188.txt._M_string_length != 0) {
            lVar30 = 0;
            uVar24 = 0;
            do {
              uVar24 = uVar24 + *(short *)(local_188.txt._M_dataplus._M_p + lVar30);
              lVar30 = lVar30 + 2;
            } while ((long)(int)local_188.txt._M_string_length * 2 != lVar30);
            uVar25 = (uint)uVar24;
          }
          lVar30 = 0;
          do {
            uVar3 = *(undefined8 *)(puVar28 + lVar30 * 4 + 3);
            if (0.2 <= ABS(((float)(ushort)((short)((ulong)uVar3 >> 0x30) +
                                            (short)((ulong)uVar3 >> 0x10) +
                                           (short)((ulong)uVar3 >> 0x20) + (short)uVar3) / 7.0) /
                           ((float)(uVar25 + uVar32) / 9.0) + -1.0)) goto LAB_00164564;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 6);
          ppuVar34 = (Iterator *)(puVar28 + 3);
          local_1b8._size = 4;
          local_e0._M_dataplus._M_p._0_4_ = 0;
          local_1b8._data = (Iterator)ppuVar34;
          local_1b8._base = puVar38;
          local_1b8._end = puVar35;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_140,0,(char *)local_140.txt._M_string_length,0x192b03);
          local_198 = uVar13;
          uVar13 = local_198;
          bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
          local_198 = uVar13;
          uVar13 = local_198;
          uVar17 = local_198._7_1_;
          if (bVar21) {
            uVar32 = 0xffffffff;
            do {
              local_198 = uVar13;
              uVar17 = local_198._7_1_;
              if (ppuVar34 == (Iterator *)0x0) {
                ppuVar34 = (Iterator *)0x0;
              }
              else {
                ppuVar34 = ppuVar34 + 1;
                local_1b8._data = (Iterator)ppuVar34;
              }
              uVar13 = local_198;
              if (uVar32 == 4) goto LAB_001644fb;
              local_198._7_1_ = uVar17;
              bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
              uVar13 = local_198;
              uVar32 = uVar32 + 1;
            } while (bVar21);
            uVar17 = local_198._7_1_;
            if (4 < uVar32) {
LAB_001644fb:
              local_198._7_1_ = uVar17;
              local_198 = uVar13;
              uVar17 = local_198._7_1_;
              uVar27 = 6;
              uVar37 = 8;
              do {
                uVar13 = local_198;
                if (*(int *)(UPCEANCommon::L_AND_G_PATTERNS + uVar37 + 0x138) ==
                    (int)local_e0._M_dataplus._M_p) {
                  uVar37 = uVar37 - 8;
LAB_0016454e:
                  iVar33 = (int)(uVar37 >> 2);
                  if (iVar33 != -1 && uVar37 != 0x50) {
                    local_198._7_1_ = uVar17;
                    cVar22 = ToDigit<char>(iVar33 / 10);
                    *local_140.txt._M_dataplus._M_p = cVar22;
                    ToDigit<char>(iVar33 % 10);
                    std::__cxx11::string::push_back((char)&local_140);
                    local_140.end._end =
                         (Iterator)
                         CONCAT17(local_188.txt.field_2._M_local_buf[0xf],
                                  CONCAT25(local_188.txt.field_2._13_2_,
                                           CONCAT14(local_188.txt.field_2._M_local_buf[0xc],
                                                    local_188.txt.field_2._8_4_)));
                    local_140.end._base._0_4_ = local_188.txt.field_2._M_allocated_capacity._0_4_;
                    local_140.end._base._4_4_ = local_188.txt.field_2._M_allocated_capacity._4_4_;
                    local_140.end._data = (Iterator)local_188.txt._M_dataplus._M_p;
                    local_140.end._size = (int)local_188.txt._M_string_length;
                    local_140.end._12_4_ = SUB84(local_188.txt._M_string_length >> 0x20,0);
                    local_140.format = UPCE;
                    local_1b8._data = (Iterator)&local_1b8._base;
                    local_1b8._8_8_ = 0;
                    local_1b8._base = (Iterator)((ulong)local_1b8._base & 0xffffffffffffff00);
                    local_198 = 0;
                    local_198._7_1_ = 0;
                    uStack_190 = 0xffff;
                    uStack_18e = 0;
                    UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::string>
                              (&local_188.txt,(UPCEANCommon *)&local_140,upce);
                    uVar13 = local_198;
                    goto LAB_001646d2;
                  }
                  break;
                }
                if (*(int *)(UPCEANCommon::L_AND_G_PATTERNS + uVar37 + 0x13c) ==
                    (int)local_e0._M_dataplus._M_p) {
                  uVar37 = uVar37 - 4;
                  goto LAB_0016454e;
                }
                if (*(int *)((long)&UPCEANCommon::NUMSYS_AND_CHECK_DIGIT_PATTERNS + uVar37) ==
                    (int)local_e0._M_dataplus._M_p) goto LAB_0016454e;
                if (*(int *)((long)&DAT_00195b20 + uVar37) == (int)local_e0._M_dataplus._M_p) {
                  uVar37 = uVar37 + 4;
                  goto LAB_0016454e;
                }
                uVar27 = uVar27 - 1;
                uVar37 = uVar37 + 0x10;
              } while (1 < uVar27);
            }
          }
        }
      }
    }
LAB_00164564:
    local_198._7_1_ = uVar17;
    local_198 = uVar13;
    uVar17 = local_198._7_1_;
    uVar13 = local_198;
    local_198._7_1_ = uVar17;
    memset(__return_storage_ptr__,0,0xd8);
    uVar13 = local_198;
    Result::Result(__return_storage_ptr__);
    local_198 = uVar13;
    uVar13 = local_198;
    uVar17 = local_198._7_1_;
    goto LAB_0016457b;
  }
  local_188.txt._M_dataplus._M_p = (pointer)(puVar28 + 0x38);
  local_188.txt._M_string_length = CONCAT44(local_188.txt._M_string_length._4_4_,3);
  puVar1 = puVar28 + 0x3b;
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  if (puVar35 < puVar1 || local_188.txt._M_dataplus._M_p < puVar38) goto LAB_00163f46;
  if (puVar1 == puVar35 + -1) {
    uVar32 = 0x7fffffff;
  }
  else {
    uVar32 = (uint)*puVar1;
  }
  dVar4 = IsPattern<false,3,3>
                    ((PatternView *)&local_188,(FixedPattern<3,_3,_false> *)&END_PATTERN,uVar32,3.0,
                     0.0);
  local_198 = uVar13;
  uVar13 = local_198;
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_00163f46;
  lVar30 = -10;
  uVar24 = 0;
  do {
    uVar24 = uVar24 + *(short *)((long)puVar28 + lVar30 + 0x40);
    lVar30 = lVar30 + 2;
  } while (lVar30 != 0);
  dVar4 = (double)uVar24 / 5.0;
  lVar30 = 0;
  do {
    if (dVar4 * 0.5 + 0.5 < ABS((double)puVar28[lVar30 + 0x1b] - dVar4)) goto LAB_00163f46;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 5);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_00163f46;
  ppuVar34 = (Iterator *)(puVar28 + 3);
  local_1b8._size = 4;
  local_1b8._data = (Iterator)ppuVar34;
  local_1b8._base = puVar38;
  local_1b8._end = puVar35;
  std::__cxx11::string::_M_replace
            ((ulong)&local_140,0,(char *)local_140.txt._M_string_length,0x192b03);
  local_198 = uVar13;
  uVar13 = local_198;
  local_e0._M_dataplus._M_p._0_4_ = 0;
  bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
  local_198 = uVar13;
  uVar13 = local_198;
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  if (!bVar21) goto LAB_00163f46;
  uVar32 = 0xffffffff;
  local_1d8 = ppuVar34;
  do {
    local_198 = uVar13;
    uVar20 = local_198._7_1_;
    if (ppuVar34 == (Iterator *)0x0) {
      ppuVar34 = (Iterator *)0x0;
    }
    else {
      ppuVar34 = ppuVar34 + 1;
      local_1d8 = ppuVar34;
      local_1b8._data = (Iterator)ppuVar34;
    }
    uVar13 = local_198;
    if (uVar32 == 4) goto LAB_00163e88;
    local_198._7_1_ = uVar20;
    bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
    uVar13 = local_198;
    uVar32 = uVar32 + 1;
  } while (bVar21);
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  uVar20 = local_198._7_1_;
  if (uVar32 < 5) goto LAB_00163f46;
LAB_00163e88:
  local_198._7_1_ = uVar20;
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  local_1d8 = (Iterator *)((long)local_1d8 + 10);
  local_1b8._size = 4;
  local_1b8._data = (Iterator)local_1d8;
  local_1b8._base = puVar38;
  local_1b8._end = puVar35;
  uVar13 = local_198;
  local_198._7_1_ = uVar17;
  bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
  uVar13 = local_198;
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  if (!bVar21) goto LAB_00163f46;
  uVar32 = 0xffffffff;
  do {
    local_198 = uVar13;
    uVar20 = local_198._7_1_;
    if (local_1d8 == (Iterator *)0x0) {
      local_1d8 = (Iterator *)0x0;
    }
    else {
      local_1d8 = local_1d8 + 1;
      local_1b8._data = (Iterator)local_1d8;
    }
    uVar13 = local_198;
    if (uVar32 == 4) goto LAB_00163f05;
    local_198._7_1_ = uVar20;
    bVar21 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
    uVar13 = local_198;
    uVar32 = uVar32 + 1;
  } while (bVar21);
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  uVar20 = local_198._7_1_;
  if (uVar32 < 5) goto LAB_00163f46;
LAB_00163f05:
  local_198._7_1_ = uVar20;
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  uVar13 = local_198;
  local_198._7_1_ = uVar17;
  piVar26 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (FIRST_DIGIT_ENCODINGS,UPCE_END_PATTERN,&local_e0);
  uVar13 = local_198;
  iVar33 = (int)((ulong)(piVar26 + -0x65cc0) >> 2);
  uVar14 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar15 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar16 = local_188.txt.field_2._8_4_;
  uVar17 = local_188.txt.field_2._M_local_buf[0xc];
  uVar18 = local_188.txt.field_2._13_2_;
  uVar19 = local_188.txt.field_2._M_local_buf[0xf];
  if (iVar33 == -1 || piVar26 == (int *)UPCE_END_PATTERN) goto LAB_00163f46;
  cVar22 = ToDigit<char>(iVar33);
  *local_140.txt._M_dataplus._M_p = cVar22;
  local_140.end._end =
       (Iterator)
       CONCAT44(CONCAT13(local_188.txt.field_2._M_local_buf[0xf],
                         CONCAT21(local_188.txt.field_2._13_2_,
                                  local_188.txt.field_2._M_local_buf[0xc])),
                local_188.txt.field_2._8_4_);
  local_140.end._size = (int)local_188.txt._M_string_length;
  local_140.end._12_4_ = local_188.txt._M_string_length._4_4_;
  local_140.format = EAN13;
LAB_00164684:
  local_1b8._data = (Iterator)&local_1b8._base;
  local_1b8._8_8_ = 0;
  local_1b8._base = (Iterator)((ulong)local_1b8._base & 0xffffffffffffff00);
  local_198 = 0;
  local_198._7_1_ = 0;
  uStack_190 = 0xffff;
  uStack_18e = 0;
  local_140.end._data = (Iterator)local_188.txt._M_dataplus._M_p;
  local_188.txt._M_dataplus._M_p = (pointer)&local_188.txt.field_2;
  local_140.end._base._0_4_ = local_188.txt.field_2._M_allocated_capacity._0_4_;
  local_140.end._base._4_4_ = local_188.txt.field_2._M_allocated_capacity._4_4_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_140.txt._M_dataplus._M_p,
             (char *)(local_140.txt._M_string_length + (long)local_140.txt._M_dataplus._M_p));
  uVar13 = local_198;
LAB_001646d2:
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  uVar13 = local_198;
  local_198._7_1_ = uVar17;
  cVar23 = GTIN::ComputeCheckDigit<char>(&local_188.txt,true);
  uVar13 = local_198;
  cVar22 = local_188.txt._M_dataplus._M_p[local_188.txt._M_string_length - 1];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
    uVar17 = local_198._7_1_;
    local_198 = uVar13;
    uVar13 = local_198;
    local_198._7_1_ = uVar17;
    operator_delete(local_188.txt._M_dataplus._M_p,
                    CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                             local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
    uVar13 = local_198;
  }
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  uVar13 = local_198;
  if (cVar23 != cVar22) {
    paVar2 = &local_188.txt.field_2;
    local_188.txt.field_2._M_allocated_capacity._1_3_ = (undefined3)uStack_3f;
    local_188.txt.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)local_188.txt.field_2._M_allocated_capacity._1_3_ << 8;
    local_188.txt.field_2._M_allocated_capacity._4_4_ = (undefined4)((uint7)uStack_3f >> 0x18);
    local_188.txt.field_2._9_3_ = (undefined3)local_37;
    local_188.txt.field_2._M_local_buf[8] = uStack_38;
    local_188.txt.field_2._M_local_buf[0xc] = (char)((uint)local_37 >> 0x18);
    local_188.txt.field_2._13_2_ = local_33;
    local_188.txt.field_2._M_local_buf[0xf] = local_31;
    local_188.txt._M_string_length = 0;
    local_48 = 0;
    local_40 = 0;
    local_188.end._data._0_4_ = 0x197368;
    local_188.end._data._4_4_ = 0;
    local_188.end._size._0_2_ = 0x11b;
    local_188.end._size._2_1_ = 2;
    local_188.txt._M_dataplus._M_p = (pointer)paVar2;
    local_50 = &local_40;
    local_198._7_1_ = uVar17;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_188);
    uVar13 = local_198;
    local_198._7_1_ = (undefined1)((uint)local_188.end._data._4_4_ >> 0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.txt._M_dataplus._M_p != paVar2) {
      uVar17 = local_198._7_1_;
      local_198 = uVar13;
      uVar13 = local_198;
      local_198._7_1_ = uVar17;
      operator_delete(local_188.txt._M_dataplus._M_p,
                      CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                               local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
      uVar13 = local_198;
    }
    local_198 = uVar13;
    uVar17 = local_198._7_1_;
    uVar13 = local_198;
    if (local_50 != &local_40) {
      local_198._7_1_ = uVar17;
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      uVar13 = local_198;
      uVar17 = local_198._7_1_;
    }
  }
  local_198._7_1_ = uVar17;
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  uVar32 = (((this->super_RowReader)._opts)->_formats).i;
  local_198._7_1_ = uVar17;
  if (local_140.format == EAN13 && (uVar32 == 0 || (uVar32 >> 0xe & 1) != 0)) {
    if (*local_140.txt._M_dataplus._M_p == '0') {
      uVar13 = local_198;
      std::__cxx11::string::substr((ulong)&local_188,(ulong)&local_140);
      uVar13 = local_198;
      uVar17 = local_198._7_1_;
      local_198 = uVar13;
      uVar13 = local_198;
      local_198._7_1_ = uVar17;
      std::__cxx11::string::operator=((string *)&local_140,(string *)&local_188);
      uVar13 = local_198;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
        uVar17 = local_198._7_1_;
        local_198 = uVar13;
        uVar13 = local_198;
        local_198._7_1_ = uVar17;
        operator_delete(local_188.txt._M_dataplus._M_p,
                        CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                                 local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
        uVar13 = local_198;
      }
      local_198 = uVar13;
      uVar17 = local_198._7_1_;
      local_140.format = UPCA;
      uVar25 = 0x30;
      goto LAB_001648e4;
    }
LAB_001648a9:
    uVar25 = 0x30;
    if ((uVar32 >> 9 & 1) != 0 || uVar32 == 0) goto LAB_001648e4;
    uVar13 = local_198;
    memset(__return_storage_ptr__,0,0xd8);
    uVar13 = local_198;
    uVar17 = local_198._7_1_;
    local_198 = uVar13;
    uVar13 = local_198;
    local_198._7_1_ = uVar17;
    Result::Result(__return_storage_ptr__);
    uVar13 = local_198;
    uVar17 = local_198._7_1_;
  }
  else {
    if (local_140.format == EAN13) goto LAB_001648a9;
    uVar25 = (byte)((local_140.format == EAN8) << 2) | 0x30;
LAB_001648e4:
    local_198._7_1_ = uVar17;
    puVar12 = local_140.end._end;
    iVar33 = local_140.end._size;
    puVar11 = local_140.end._data;
    uVar17 = local_198._7_1_;
    next->_base = (Iterator)CONCAT44(local_140.end._base._4_4_,local_140.end._base._0_4_);
    next->_end = local_140.end._end;
    next->_data = local_140.end._data;
    *(ulong *)&next->_size = CONCAT44(local_140.end._12_4_,local_140.end._size);
    local_f0 = CONCAT44(local_140.end._base._0_4_,local_140.end._12_4_);
    local_e8 = local_140.end._base._4_4_;
    uVar13 = local_198;
    local_198._7_1_ = uVar17;
    PartialResult::PartialResult(&local_188);
    uVar13 = local_198;
    local_1cc = uVar25;
    uVar17 = local_198._7_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0 && (((this->super_RowReader)._opts)->field_0x1 & 0x60) != 0) {
      lVar30 = (long)iVar33;
      puVar35 = (ushort *)((long)puVar11 + lVar30 * 2);
      if (puVar35 + lVar30 <= puVar12) {
        if ((int)local_f8 == 0) {
          iVar29 = 0;
        }
        else {
          lVar31 = 0;
          uVar24 = 0;
          do {
            uVar24 = uVar24 + *(short *)((long)puVar28 + lVar31);
            lVar31 = lVar31 + 2;
          } while (local_f8 * 2 != lVar31);
          iVar29 = (int)((double)uVar24 * 3.5);
        }
        if ((puVar35 + lVar30 + 1 <= puVar12) && ((int)(uint)*puVar35 <= iVar29)) {
          puVar35 = puVar35 + 1;
          iStack_98 = iVar33;
          uStack_94 = (undefined4)local_f0;
          uStack_90 = (undefined4)((ulong)local_f0 >> 0x20);
          uStack_8c = local_e8;
          puStack_88 = puVar12;
          begin._12_4_ = uStack_94;
          begin._size = iVar33;
          begin._data = puVar35;
          begin._base._0_4_ = uStack_90;
          begin._base._4_4_ = local_e8;
          begin._end = puVar12;
          local_198 = uVar13;
          local_a0 = puVar35;
          uVar13 = local_198;
          local_198._7_1_ = uVar17;
          bVar21 = AddOn(&local_188,begin,5);
          uVar13 = local_198;
          if (!bVar21) {
            iStack_b8 = iVar33;
            uStack_b4 = (undefined4)local_f0;
            uStack_b0 = (undefined4)((ulong)local_f0 >> 0x20);
            uStack_ac = local_e8;
            puStack_a8 = puVar12;
            begin_00._12_4_ = uStack_b4;
            begin_00._size = iVar33;
            begin_00._data = puVar35;
            begin_00._base._0_4_ = uStack_b0;
            begin_00._base._4_4_ = local_e8;
            begin_00._end = puVar12;
            uVar17 = local_198._7_1_;
            local_198 = uVar13;
            local_c0 = puVar35;
            uVar13 = local_198;
            local_198._7_1_ = uVar17;
            bVar21 = AddOn(&local_188,begin_00,2);
            uVar13 = local_198;
            uVar17 = local_198._7_1_;
            if (!bVar21) goto LAB_001649d9;
          }
          local_198 = uVar13;
          uVar17 = local_198._7_1_;
          uVar13 = local_198;
          local_198._7_1_ = uVar17;
          std::operator+(&local_e0," ",&local_188.txt);
          uVar13 = local_198;
          uVar17 = local_198._7_1_;
          local_198 = uVar13;
          uVar13 = local_198;
          local_198._7_1_ = uVar17;
          std::__cxx11::string::_M_append
                    ((char *)&local_140,
                     CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p));
          uVar13 = local_198;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p) !=
              &local_e0.field_2) {
            uVar17 = local_198._7_1_;
            local_198 = uVar13;
            uVar13 = local_198;
            local_198._7_1_ = uVar17;
            operator_delete((undefined1 *)
                            CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p)
                            ,local_e0.field_2._M_allocated_capacity + 1);
            uVar13 = local_198;
          }
          local_198 = uVar13;
          uVar17 = local_198._7_1_;
          next->_base = local_188.end._base;
          next->_end = local_188.end._end;
          *(undefined4 *)&next->_data = local_188.end._data._0_4_;
          *(undefined4 *)((long)&next->_data + 4) = local_188.end._data._4_4_;
          next->_size = CONCAT13(local_188.end._size._3_1_,
                                 CONCAT12(local_188.end._size._2_1_,(undefined2)local_188.end._size)
                                );
          *(undefined4 *)&next->field_0xc = local_188.end._12_4_;
          local_1cc = 0x33;
          uVar13 = local_198;
          if (local_140.format == EAN8) {
            local_1cc = uVar25;
          }
        }
      }
    }
LAB_001649d9:
    local_198._7_1_ = uVar17;
    local_198 = uVar13;
    format = local_140.format;
    uVar17 = local_198._7_1_;
    local_198._7_1_ = uVar17;
    if ((((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x6000) ==
         (undefined1  [12])0x4000) && (local_188.format == None)) {
      uVar13 = local_198;
      memset(__return_storage_ptr__,0,0xd8);
      uVar13 = local_198;
      uVar17 = local_198._7_1_;
      local_198 = uVar13;
      uVar13 = local_198;
      local_198._7_1_ = uVar17;
      Result::Result(__return_storage_ptr__);
      uVar13 = local_198;
    }
    else {
      if (puVar38 == puVar28) {
        local_1e0 = 0;
      }
      else {
        uVar24 = 0;
        do {
          uVar24 = uVar24 + *puVar38;
          puVar38 = puVar38 + 1;
        } while (puVar38 != puVar28);
        local_1e0 = (uint)uVar24;
      }
      puVar28 = next->_base;
      if (puVar28 == next->_data + next->_size) {
        iVar33 = -1;
      }
      else {
        uVar24 = 0;
        do {
          uVar24 = uVar24 + *puVar28;
          puVar28 = puVar28 + 1;
        } while (puVar28 != next->_data + next->_size);
        iVar33 = uVar24 - 1;
      }
      paVar2 = &local_80._msg.field_2;
      local_80._msg._M_dataplus._M_p = (pointer)paVar2;
      uVar13 = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_1b8._data,local_1b8._8_8_ + (long)local_1b8._data);
      uVar13 = local_198;
      local_80._file._0_7_ = (undefined7)uVar13;
      local_80._40_3_ = SUB43(CONCAT13(uStack_18e,CONCAT21(uStack_190,local_198._7_1_)) >> 8,0);
      local_80._file._7_1_ = (undefined1)((ulong)uVar13 >> 0x38);
      uVar17 = local_198._7_1_;
      local_198 = uVar13;
      uVar13 = local_198;
      local_198._7_1_ = uVar17;
      Result::Result(__return_storage_ptr__,&local_140.txt,local_e4,local_1e0,iVar33,format,
                     (SymbologyIdentifier)(local_1cc << 8 | 0x45),&local_80,false);
      uVar13 = local_198;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._msg._M_dataplus._M_p != paVar2) {
        uVar17 = local_198._7_1_;
        local_198 = uVar13;
        uVar13 = local_198;
        local_198._7_1_ = uVar17;
        operator_delete(local_80._msg._M_dataplus._M_p,
                        local_80._msg.field_2._M_allocated_capacity + 1);
        uVar13 = local_198;
      }
    }
    local_198 = uVar13;
    uVar17 = local_198._7_1_;
    uVar13 = local_198;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
      local_198._7_1_ = uVar17;
      operator_delete(local_188.txt._M_dataplus._M_p,
                      CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                               local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
      uVar13 = local_198;
      uVar17 = local_198._7_1_;
    }
  }
  local_198._7_1_ = uVar17;
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  uVar13 = local_198;
  if ((Iterator *)local_1b8._data != &local_1b8._base) {
    local_198._7_1_ = uVar17;
    operator_delete(local_1b8._data,(long)local_1b8._base + 1);
    uVar13 = local_198;
    uVar17 = local_198._7_1_;
  }
LAB_0016457b:
  local_198._7_1_ = uVar17;
  local_198 = uVar13;
  uVar17 = local_198._7_1_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.txt._M_dataplus._M_p != &local_140.txt.field_2) {
    uVar13 = local_198;
    local_198._7_1_ = uVar17;
    operator_delete(local_140.txt._M_dataplus._M_p,local_140.txt.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode MultiUPCEANReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	const int minSize = 3 + 6*4 + 6; // UPC-E

	next = FindLeftGuard(next, minSize, END_PATTERN, QUIET_ZONE_LEFT);
	if (!next.isValid())
		return {};

	PartialResult res;
	auto begin = next;
	
	if (!(((_opts.hasFormat(BarcodeFormat::EAN13 | BarcodeFormat::UPCA)) && EAN13(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::EAN8) && EAN8(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::UPCE) && UPCE(res, begin))))
		return {};

	Error error;
	if (!GTIN::IsCheckDigitValid(res.format == BarcodeFormat::UPCE ? UPCEANCommon::ConvertUPCEtoUPCA(res.txt) : res.txt))
		error = ChecksumError();

	// If UPC-A was a requested format and we detected a EAN-13 code with a leading '0', then we drop the '0' and call it
	// a UPC-A code.
	// TODO: this is questionable
	if (_opts.hasFormat(BarcodeFormat::UPCA) && res.format == BarcodeFormat::EAN13 && res.txt.front() == '0') {
		res.txt = res.txt.substr(1);
		res.format = BarcodeFormat::UPCA;
	}

	// if we explicitly requested UPCA but not EAN13, don't return an EAN13 symbol
	if (res.format == BarcodeFormat::EAN13 && ! _opts.hasFormat(BarcodeFormat::EAN13))
		return {};

	// Symbology identifier modifiers ISO/IEC 15420:2009 Annex B Table B.1
	// ISO/IEC 15420:2009 (& GS1 General Specifications 5.1.3) states that the content for "]E0" should be 13 digits,
	// i.e. converted to EAN-13 if UPC-A/E, but not doing this here to maintain backward compatibility
	SymbologyIdentifier symbologyIdentifier = {'E', res.format == BarcodeFormat::EAN8 ? '4' : '0'};

	next = res.end;

	auto ext = res.end;
	PartialResult addOnRes;
	if (_opts.eanAddOnSymbol() != EanAddOnSymbol::Ignore && ext.skipSymbol() && ext.skipSingle(static_cast<int>(begin.sum() * 3.5))
		&& (AddOn(addOnRes, ext, 5) || AddOn(addOnRes, ext, 2))) {
		// ISO/IEC 15420:2009 states that the content for "]E3" should be 15 or 18 digits, i.e. converted to EAN-13
		// and extended with no separator, and that the content for "]E4" should be 8 digits, i.e. no add-on
		res.txt += " " + addOnRes.txt;
		next = addOnRes.end;

		if (res.format != BarcodeFormat::EAN8) // Keeping EAN-8 with add-on as "]E4"
			symbologyIdentifier.modifier = '3'; // Combined packet, EAN-13, UPC-A, UPC-E, with add-on
	}
	
	if (_opts.eanAddOnSymbol() == EanAddOnSymbol::Require && !addOnRes.isValid())
		return {};

	return Barcode(res.txt, rowNumber, begin.pixelsInFront(), next.pixelsTillEnd(), res.format, symbologyIdentifier, error);
}